

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::edit_distance::anon_unknown_1::Hunk::PrintTo(Hunk *this,ostream *os)

{
  bool bVar1;
  pointer ppVar2;
  ostream *poVar3;
  Hunk *in_RSI;
  const_iterator it;
  Hunk *in_stack_ffffffffffffffb8;
  Hunk *in_stack_ffffffffffffffc0;
  iterator local_30;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_28;
  iterator local_20;
  _List_const_iterator<std::pair<char,_const_char_*>_> local_18;
  
  PrintHeader(in_stack_ffffffffffffffc0,(ostream *)in_stack_ffffffffffffffb8);
  FlushEdits(in_RSI);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::begin
                 ((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                   *)in_stack_ffffffffffffffb8);
  std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
            (&local_18,&local_20);
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>::end
                   ((list<std::pair<char,_const_char_*>,_std::allocator<std::pair<char,_const_char_*>_>_>
                     *)in_stack_ffffffffffffffb8);
    std::_List_const_iterator<std::pair<char,_const_char_*>_>::_List_const_iterator
              (&local_28,&local_30);
    in_stack_ffffffffffffffb8 = in_RSI;
    bVar1 = std::operator!=(&local_18,&local_28);
    if (!bVar1) break;
    in_RSI = in_stack_ffffffffffffffb8;
    ppVar2 = std::_List_const_iterator<std::pair<char,_const_char_*>_>::operator->
                       ((_List_const_iterator<std::pair<char,_const_char_*>_> *)
                        in_stack_ffffffffffffffc0);
    in_stack_ffffffffffffffc0 =
         (Hunk *)std::operator<<((ostream *)in_stack_ffffffffffffffb8,ppVar2->first);
    ppVar2 = std::_List_const_iterator<std::pair<char,_const_char_*>_>::operator->
                       ((_List_const_iterator<std::pair<char,_const_char_*>_> *)
                        in_stack_ffffffffffffffc0);
    poVar3 = std::operator<<((ostream *)in_stack_ffffffffffffffc0,ppVar2->second);
    std::operator<<(poVar3,"\n");
    std::_List_const_iterator<std::pair<char,_const_char_*>_>::operator++(&local_18);
  }
  return;
}

Assistant:

void PrintTo(std::ostream* os) {
    PrintHeader(os);
    FlushEdits();
    for (std::list<std::pair<char, const char*> >::const_iterator it =
             hunk_.begin();
         it != hunk_.end(); ++it) {
      *os << it->first << it->second << "\n";
    }
  }